

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

void __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::renderRawVariable
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          VariableTag *tag,SizeT *offset)

{
  uint uVar1;
  StringStream<char> *pSVar2;
  char *pcVar3;
  bool bVar4;
  uint size;
  SizeT SVar5;
  Value<char> *this_00;
  uint uVar6;
  uint uVar7;
  uint size_00;
  
  pSVar2 = this->stream_;
  uVar1 = *offset;
  size = tag->Length + 6;
  uVar7 = tag->Offset - 5;
  SVar5 = pSVar2->length_;
  size_00 = uVar7 - uVar1;
  pcVar3 = this->content_;
  uVar6 = SVar5 + size_00;
  if (pSVar2->capacity_ < uVar6) {
    StringStream<char>::expand(pSVar2,uVar6);
    SVar5 = pSVar2->length_;
  }
  Memory::Copy<unsigned_int>(pSVar2->storage_ + SVar5,pcVar3 + uVar1,size_00);
  pSVar2->length_ = uVar6;
  *offset = size + uVar7;
  this_00 = getValue(this,tag);
  if ((this_00 != (Value<char> *)0x0) &&
     (bVar4 = Value<char>::
              CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>,char_const*,unsigned_int)>
                        (this_00,this->stream_,(RealFormatInfo)0x200000002,
                         (_func_void_StringStream<char>_char_ptr_uint *)0x0), bVar4)) {
    return;
  }
  pSVar2 = this->stream_;
  pcVar3 = this->content_;
  SVar5 = pSVar2->length_;
  uVar6 = SVar5 + size;
  if (pSVar2->capacity_ < uVar6) {
    StringStream<char>::expand(pSVar2,uVar6);
    SVar5 = pSVar2->length_;
  }
  Memory::Copy<unsigned_int>(pSVar2->storage_ + SVar5,pcVar3 + uVar7,size);
  pSVar2->length_ = uVar6;
  return;
}

Assistant:

void renderRawVariable(const VariableTag &tag, SizeT &offset) const {
        const SizeT t_offset = (tag.Offset - TagPatterns::RawVariablePrefixLength);
        const SizeT length   = (tag.Length + TagPatterns::RawVariableFullLength);

        stream_->Write((content_ + offset), (t_offset - offset));
        offset = t_offset;
        offset += length;

        const Value_T *value = getValue(tag);

        if ((value == nullptr) ||
            !(value->CopyValueTo(*stream_, {Config::TemplatePrecision, QENTEM_TEMPLATE_DOUBLE_FORMAT}))) {
            stream_->Write((content_ + t_offset), length);
        }
    }